

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cc
# Opt level: O3

int main(void)

{
  char cVar1;
  char cVar2;
  char cVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  Context context;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_e0;
  undefined4 *local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 *local_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  string local_68;
  string local_48;
  
  local_e0._M_buckets = &local_e0._M_single_bucket;
  local_e0._M_bucket_count = 1;
  local_e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_e0._M_element_count = 0;
  local_e0._M_rehash_policy._M_max_load_factor = 1.0;
  local_e0._M_rehash_policy._M_next_resize = 0;
  local_e0._M_single_bucket = (__node_base_ptr)0x0;
  local_48.field_2._M_allocated_capacity._0_4_ = 0x544143;
  local_48._M_string_length = 3;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  Context::set((Context *)&local_e0,&local_48,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT44(local_48.field_2._M_allocated_capacity._4_4_,
                             local_48.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_68.field_2._M_allocated_capacity._0_4_ = 0x474f44;
  local_68._M_string_length = 3;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  Context::set((Context *)&local_e0,&local_68,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT44(local_68.field_2._M_allocated_capacity._4_4_,
                             local_68.field_2._M_allocated_capacity._0_4_) + 1);
  }
  puVar4 = (undefined8 *)operator_new(0x28);
  local_78 = 0x544143;
  local_80 = 3;
  *puVar4 = &PTR_interpret_00103d98;
  puVar4[1] = puVar4 + 3;
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar4 + 1),&local_78,(long)&local_78 + 3);
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT44(uStack_74,local_78) + 1);
  }
  puVar5 = (undefined8 *)operator_new(0x28);
  local_98 = 0x474f44;
  local_a0 = 3;
  *puVar5 = &PTR_interpret_00103d98;
  puVar5[1] = puVar5 + 3;
  local_a8 = &local_98;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar5 + 1),&local_98,(long)&local_98 + 3);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT44(uStack_94,local_98) + 1);
  }
  cVar1 = (**(code **)*puVar4)(puVar4,&local_e0);
  if (cVar1 == '\0') {
    cVar1 = '\0';
  }
  else {
    cVar1 = (**(code **)*puVar4)(puVar4,&local_e0);
  }
  cVar2 = (**(code **)*puVar4)(puVar4,&local_e0);
  if (cVar2 == '\0') {
    cVar2 = '\0';
  }
  else {
    cVar2 = (**(code **)*puVar5)(puVar5,&local_e0);
  }
  cVar3 = (**(code **)*puVar5)(puVar5,&local_e0);
  if (cVar3 == '\0') {
    cVar3 = '\0';
  }
  else {
    cVar3 = (**(code **)*puVar5)(puVar5,&local_e0);
  }
  if (cVar1 != '\0') {
    __assert_fail("exper1 == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/interpreter_test.cc"
                  ,0x16,"int main()");
  }
  if (cVar2 != '\0') {
    __assert_fail("exper2 == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/interpreter_test.cc"
                  ,0x17,"int main()");
  }
  if (cVar3 != '\0') {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_e0);
    return 0;
  }
  __assert_fail("exper3 == true",
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/interpreter_test.cc"
                ,0x18,"int main()");
}

Assistant:

int main() {
  Context context;

  context.set("CAT", false);
  context.set("DOG", true);

  AbstractExpression *cat = new TerminalExpression("CAT");
  AbstractExpression *dog = new TerminalExpression("DOG");
  AbstractExpression *cat_and_cat = new NonTerminalExpression(cat, cat);
  AbstractExpression *cat_and_dog = new NonTerminalExpression(cat, dog);
  AbstractExpression *dog_and_dog = new NonTerminalExpression(dog, dog);

  bool exper1 = cat_and_cat->interpret(&context);
  bool exper2 = cat_and_dog->interpret(&context);
  bool exper3 = dog_and_dog->interpret(&context);
  assert(exper1 == false);
  assert(exper2 == false);
  assert(exper3 == true);
}